

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O2

SchnorrPubkey *
cfd::core::SchnorrPubkey::FromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,bool *parity)

{
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *pCVar2;
  int pk_parity;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_e8;
  secp256k1_xonly_pubkey x_only_pubkey;
  secp256k1_keypair keypair;
  
  ctx = wally_get_secp_context();
  Privkey::GetData((ByteData *)&local_e8,privkey);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&x_only_pubkey,
                     (ByteData *)&local_e8);
  iVar1 = secp256k1_keypair_create(ctx,&keypair,(uchar *)x_only_pubkey.data._0_8_);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&x_only_pubkey);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
  if (iVar1 != 1) {
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&x_only_pubkey,"Invalid private key",(allocator *)&local_e8);
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&x_only_pubkey);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  pk_parity = 0;
  iVar1 = secp256k1_keypair_xonly_pub(ctx,&x_only_pubkey,&pk_parity,&keypair);
  if (iVar1 == 1) {
    if (parity != (bool *)0x0) {
      *parity = pk_parity != 0;
    }
    ConvertSchnorrPubkey((ByteData256 *)&local_e8,&x_only_pubkey);
    SchnorrPubkey(__return_storage_ptr__,(ByteData256 *)&local_e8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_e8);
    return __return_storage_ptr__;
  }
  pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
  CfdException::CfdException(pCVar2,kCfdInternalError);
  __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

SchnorrPubkey SchnorrPubkey::FromPrivkey(
    const Privkey &privkey, bool *parity) {
  auto ctx = wally_get_secp_context();
  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);

  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}